

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

int __thiscall
ON_BoundingBox::GetClosestPoint
          (ON_BoundingBox *this,ON_Line *line,ON_3dPoint *box_point,double *t0,double *t1)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  ON_3dPoint *pOVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  ON_BoundingBox *pOVar13;
  ON_3dPoint *pOVar14;
  int iVar15;
  int iVar16;
  ON_3dVector *__return_storage_ptr__;
  long lVar17;
  int iVar18;
  int iVar19;
  int j;
  long lVar20;
  int iVar21;
  ulong uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  uint uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  double dVar28;
  double dVar29;
  uint local_1bc;
  ON_3dPoint closest;
  int local_150;
  int local_14c;
  ON_3dVector n;
  double local_120;
  int ihi [3];
  ON_3dVector ProjDir;
  ON_Interval overlap;
  ON_Interval pl;
  ON_3dPoint cp;
  int ilo [3];
  ON_3dPoint center;
  
  bVar6 = IsNotEmpty(this);
  local_1bc = 0;
  uVar5 = local_1bc;
  if ((bVar6) && (bVar6 = ON_Line::IsValid(line), bVar6)) {
    __return_storage_ptr__ = (ON_3dVector *)&center;
    ON_Line::Direction(__return_storage_ptr__,line);
    dVar28 = ON_3dVector::Length(__return_storage_ptr__);
    if (dVar28 <= 1.490116119385e-08) {
      ON_Line::PointAt(&center,line,0.5);
      if (t0 != (double *)0x0) {
        *t0 = 0.0;
      }
      if (t1 != (double *)0x0) {
        *t1 = 1.0;
      }
      ClosestPoint(&closest,this,&center);
      box_point->z = closest.z;
      box_point->x = closest.x;
      box_point->y = closest.y;
      bVar6 = IsPointIn(this,&center,0);
      uVar5 = (uint)bVar6 * 2 + 1;
    }
    else {
      lVar20 = 0;
      do {
        ON_Interval::ON_Interval((ON_Interval *)((long)&center.x + lVar20));
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x30);
      pOVar14 = &this->m_max;
      for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
        pOVar8 = ON_Line::operator[](line,0);
        iVar7 = (int)lVar20;
        dVar28 = ON_3dPoint::operator[](pOVar8,iVar7);
        pOVar8 = ON_Line::operator[](line,1);
        dVar29 = ON_3dPoint::operator[](pOVar8,iVar7);
        ON_Interval::ON_Interval(&pl,dVar28,dVar29);
        pdVar9 = ON_Interval::operator[](&pl,0);
        dVar28 = *pdVar9;
        pdVar9 = ON_Interval::operator[](&pl,1);
        if ((dVar28 != *pdVar9) || (NAN(dVar28) || NAN(*pdVar9))) {
          closest.z = (this->m_min).z;
          closest.x = (this->m_min).x;
          closest.y = (this->m_min).y;
          pdVar9 = ON_3dPoint::operator[](&closest,iVar7);
          dVar28 = ON_Interval::NormalizedParameterAt(&pl,*pdVar9);
          n.z = (this->m_max).z;
          n.x = pOVar14->x;
          n.y = (this->m_max).y;
          pdVar9 = ON_3dPoint::operator[]((ON_3dPoint *)&n,iVar7);
          dVar29 = ON_Interval::NormalizedParameterAt(&pl,*pdVar9);
          ON_Interval::ON_Interval((ON_Interval *)&ProjDir,dVar28,dVar29);
          uVar23 = ProjDir.x._0_4_;
          uVar24 = ProjDir.x._4_4_;
          uVar26 = ProjDir.y._0_4_;
          uVar27 = ProjDir.y._4_4_;
        }
        else {
          closest.z = (this->m_min).z;
          closest.x = (this->m_min).x;
          closest.y = (this->m_min).y;
          pdVar9 = ON_3dPoint::operator[](&closest,iVar7);
          dVar28 = *pdVar9;
          pdVar9 = ON_Interval::operator[](&pl,0);
          if (*pdVar9 < dVar28) {
LAB_004089fa:
            uVar23 = 0x9e331dd2;
            uVar24 = 0xffe5f8bd;
            dVar28 = -1.23432101234321e+308;
          }
          else {
            pdVar9 = ON_Interval::operator[](&pl,0);
            dVar28 = *pdVar9;
            n.x = pOVar14->x;
            n.y = (this->m_max).y;
            n.z = (this->m_max).z;
            pdVar9 = ON_3dPoint::operator[]((ON_3dPoint *)&n,iVar7);
            if (*pdVar9 < dVar28) goto LAB_004089fa;
            uVar23 = 0xffffffff;
            uVar24 = 0xffefffff;
            dVar28 = 1.79769313486232e+308;
          }
          ON_Interval::ON_Interval((ON_Interval *)&closest,(double)CONCAT44(uVar24,uVar23),dVar28);
          uVar23 = closest.x._0_4_;
          uVar24 = closest.x._4_4_;
          uVar26 = closest.y._0_4_;
          uVar27 = closest.y._4_4_;
        }
        *(undefined4 *)&__return_storage_ptr__->x = uVar23;
        *(undefined4 *)((long)&__return_storage_ptr__->x + 4) = uVar24;
        *(undefined4 *)&__return_storage_ptr__->y = uVar26;
        *(undefined4 *)((long)&__return_storage_ptr__->y + 4) = uVar27;
        __return_storage_ptr__ = (ON_3dVector *)&__return_storage_ptr__->z;
      }
      ON_Interval::ON_Interval(&overlap,-1.79769313486232e+308,1.79769313486232e+308);
      bVar6 = true;
      pOVar8 = &center;
      uVar22 = 0;
      while ((uVar22 < 3 && (bVar6 != false))) {
        bVar6 = ON_Interval::Intersection(&overlap,(ON_Interval *)pOVar8);
        uVar22 = uVar22 + 1;
        pOVar8 = (ON_3dPoint *)&pOVar8->z;
      }
      if (bVar6 == false) {
        lVar20 = 0;
        pdVar9 = &(this->m_min).z;
        pdVar10 = &(this->m_max).z;
        local_120 = 1.0;
LAB_00408c44:
        for (; lVar20 != 3; lVar20 = lVar20 + 1) {
          iVar7 = (int)lVar20;
          uVar22 = 0;
          if (lVar20 != 2) {
            uVar22 = (ulong)(iVar7 + 1);
          }
          uVar11 = (ulong)(iVar7 - 1);
          if (lVar20 == 0) {
            uVar11 = 2;
          }
          bVar6 = ON_Interval::Intersection
                            (&overlap,(ON_Interval *)(&center.x + uVar22 * 2),
                             (ON_Interval *)(&center.x + uVar11 * 2));
          if (!bVar6) {
            ON_3dVector::ON_3dVector((ON_3dVector *)&closest,0.0,0.0,0.0);
            pdVar12 = ON_3dVector::operator[]((ON_3dVector *)&closest,iVar7);
            *pdVar12 = 1.0;
            ON_Line::Direction((ON_3dVector *)&pl,line);
            ON_CrossProduct(&n,(ON_3dVector *)&pl,(ON_3dVector *)&closest);
            dVar28 = ON_3dVector::Length(&n);
            if ((dVar28 != 0.0) || (NAN(dVar28))) goto LAB_00408d1f;
          }
        }
        iVar7 = 0;
        while( true ) {
          ProjDir.x = (double)CONCAT44(ProjDir.x._4_4_,iVar7);
          if (iVar7 == 2) break;
          iVar15 = 0;
          lVar20 = 0;
          if (iVar7 == 1) {
            lVar20 = 0x18;
          }
          while( true ) {
            ProjDir.x = (double)CONCAT44(iVar15,ProjDir.x._0_4_);
            if (iVar15 == 2) break;
            lVar17 = 8;
            if (iVar15 == 1) {
              lVar17 = 0x20;
            }
            iVar16 = 0;
            while( true ) {
              ProjDir.y = (double)CONCAT44(ProjDir.y._4_4_,iVar16);
              if (iVar16 == 2) break;
              closest.x = *(double *)((long)&(this->m_min).x + lVar20);
              closest.y = *(double *)((long)&(this->m_min).x + lVar17);
              pdVar12 = pdVar9;
              if (iVar16 == 1) {
                pdVar12 = pdVar10;
              }
              closest.z = *pdVar12;
              ON_Line::ClosestPointTo(line,&closest,&cp.x);
              ON_Line::PointAt((ON_3dPoint *)&n,line,cp.x);
              ON_3dPoint::operator-((ON_3dVector *)&pl,(ON_3dPoint *)&n,&closest);
              bVar6 = true;
              uVar22 = 0;
              while ((uVar22 < 2 && (bVar6))) {
                iVar1 = *(int *)((long)overlap.m_t + uVar22 * 4 + -0x18);
                pdVar12 = ON_3dVector::operator[]((ON_3dVector *)&pl,(int)uVar22);
                bVar6 = 0.0 <= *pdVar12;
                if (iVar1 == 0) {
                  bVar6 = *pdVar12 <= 0.0;
                }
                uVar22 = uVar22 + 1;
              }
              if (bVar6) {
                if (t0 != (double *)0x0) {
                  *t0 = cp.x;
                }
                if (t1 != (double *)0x0) {
                  *t1 = cp.x;
                }
                box_point->z = closest.z;
                box_point->x = closest.x;
                box_point->y = closest.y;
                return 1;
              }
              iVar16 = iVar16 + 1;
            }
            iVar15 = iVar15 + 1;
          }
          iVar7 = iVar7 + 1;
        }
        iVar7 = 0;
        while( true ) {
          if (iVar7 == 2) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bounding_box.cpp"
                       ,0x6e6,"","Should never get here.");
            return 0;
          }
          pOVar14 = ON_Line::operator[](line,iVar7);
          ClosestPoint((ON_3dPoint *)&n,this,pOVar14);
          closest.z = n.z;
          closest.x = n.x;
          closest.y = n.y;
          pOVar14 = ON_Line::operator[](line,iVar7);
          ON_3dPoint::operator-(&n,&closest,pOVar14);
          ON_Line::Direction((ON_3dVector *)&pl,line);
          dVar28 = ON_3dVector::operator*(&n,(ON_3dVector *)&pl);
          if ((iVar7 == 0) && (dVar28 <= 0.0)) break;
          iVar15 = iVar7 + 1;
          bVar6 = iVar7 == 1;
          iVar7 = iVar15;
          if ((bVar6) && (0.0 <= dVar28)) {
LAB_0040938e:
            if (t0 != (double *)0x0) {
              *t0 = local_120;
            }
            if (t1 != (double *)0x0) {
              *t1 = local_120;
            }
            box_point->z = closest.z;
            box_point->x = closest.x;
            box_point->y = closest.y;
            return 1;
          }
        }
        local_120 = 0.0;
        goto LAB_0040938e;
      }
      ON_Interval::ON_Interval((ON_Interval *)&closest,0.0,1.0);
      bVar6 = ON_Interval::Intersection(&overlap,(ON_Interval *)&closest);
      if (bVar6) {
        if (t0 != (double *)0x0) {
          pdVar9 = ON_Interval::operator[](&overlap,0);
          *t0 = *pdVar9;
        }
        if (t1 != (double *)0x0) {
          pdVar9 = ON_Interval::operator[](&overlap,1);
          *t1 = *pdVar9;
        }
        pdVar9 = ON_Interval::operator[](&overlap,0);
        ON_Line::PointAt(&closest,line,*pdVar9);
        box_point->z = closest.z;
        box_point->x = closest.x;
        box_point->y = closest.y;
        dVar28 = ON_Interval::Length(&overlap);
        uVar5 = 0.0 < dVar28 | 2;
      }
      else {
        local_1bc = 1;
        pdVar9 = ON_Interval::operator[](&overlap,1);
        uVar25 = ~(uint)(-(ulong)(*pdVar9 < 0.0) >> 0x20) & 0x3ff00000;
        if (t0 != (double *)0x0) {
          *t0 = (double)((ulong)uVar25 << 0x20);
        }
        uVar5 = 1;
        if (t1 != (double *)0x0) {
          *t1 = (double)((ulong)uVar25 << 0x20);
          uVar5 = local_1bc;
        }
      }
    }
  }
  local_1bc = uVar5;
  return local_1bc;
LAB_00408d1f:
  ON_3dVector::Unitize(&n);
  ilo[2] = 0;
  ilo[0] = 0;
  ilo[1] = 0;
  ihi[0] = 1;
  ihi[1] = 1;
  ihi[2] = 1;
  ihi[lVar20] = ilo[lVar20];
  iVar4 = ihi[2];
  iVar16 = ihi[0];
  iVar1 = ihi[1];
  lVar20 = lVar20 + 1;
  dVar28 = 0.0;
  local_150 = -1;
  iVar15 = -1;
  local_14c = local_150;
  for (iVar18 = 0; iVar18 <= iVar16; iVar18 = iVar18 + 1) {
    uVar11 = 0;
    uVar22 = 0x18;
    if (iVar18 == 0) {
      uVar22 = uVar11;
    }
    while (iVar21 = (int)uVar11, iVar21 <= iVar1) {
      lVar17 = 0x20;
      if (iVar21 == 0) {
        lVar17 = 8;
      }
      for (iVar19 = 0; iVar19 <= iVar4; iVar19 = iVar19 + 1) {
        ProjDir.x = *(double *)((long)&(this->m_min).x + uVar22);
        ProjDir.y = *(double *)((long)&(this->m_min).x + lVar17);
        pdVar12 = pdVar10;
        if (iVar19 == 0) {
          pdVar12 = pdVar9;
        }
        ProjDir.z = *pdVar12;
        ON_3dPoint::operator-((ON_3dVector *)&pl,(ON_3dPoint *)&ProjDir,&line->from);
        dVar29 = ON_3dVector::operator*(&n,(ON_3dVector *)&pl);
        if (((dVar28 == 0.0) && (!NAN(dVar28))) || (ABS(dVar29) < ABS(dVar28))) {
          dVar28 = dVar29;
          local_150 = iVar21;
          local_14c = iVar19;
          iVar15 = iVar18;
        }
      }
      uVar11 = (ulong)(iVar21 + 1);
    }
  }
  if (iVar15 < 0) {
    return 0;
  }
  pOVar13 = (ON_BoundingBox *)pOVar14;
  if (iVar15 == 0) {
    pOVar13 = this;
  }
  pl.m_t[0] = (pOVar13->m_min).x;
  pOVar8 = &this->m_min;
  if (0 < local_150) {
    pOVar8 = &this->m_max;
  }
  pl.m_t[1] = pOVar8->y;
  pdVar12 = pdVar9;
  if (0 < local_14c) {
    pdVar12 = pdVar10;
  }
  dVar28 = *pdVar12;
  dVar29 = ON_3dPoint::operator[](&line->from,iVar7);
  pdVar12 = ON_3dPoint::operator[]((ON_3dPoint *)&pl,iVar7);
  *pdVar12 = dVar29;
  ON_Line::Direction(&ProjDir,line);
  pdVar12 = ON_3dVector::operator[](&ProjDir,iVar7);
  *pdVar12 = 0.0;
  ON_3dPoint::operator-((ON_3dVector *)&cp,(ON_3dPoint *)&pl,&line->from);
  dVar29 = ON_3dVector::operator*((ON_3dVector *)&cp,&ProjDir);
  dVar2 = ON_3dVector::LengthSquared(&ProjDir);
  dVar29 = dVar29 / dVar2;
  ON_Line::PointAt(&cp,line,dVar29);
  if ((0.0 <= dVar29) && (dVar29 <= 1.0)) {
    dVar2 = ON_3dPoint::operator[](&this->m_min,iVar7);
    pdVar12 = ON_3dPoint::operator[](&cp,iVar7);
    if (dVar2 <= *pdVar12) {
      pdVar12 = ON_3dPoint::operator[](&cp,iVar7);
      dVar2 = *pdVar12;
      dVar3 = ON_3dPoint::operator[](pOVar14,iVar7);
      if (dVar2 <= dVar3) {
        if (t0 != (double *)0x0) {
          *t0 = dVar29;
        }
        if (t1 != (double *)0x0) {
          *t1 = dVar29;
        }
        pdVar9 = ON_3dPoint::operator[](&cp,iVar7);
        dVar29 = *pdVar9;
        pdVar9 = ON_3dPoint::operator[]((ON_3dPoint *)&pl,iVar7);
        *pdVar9 = dVar29;
        box_point->x = pl.m_t[0];
        box_point->y = pl.m_t[1];
        box_point->z = dVar28;
        return 1;
      }
    }
  }
  goto LAB_00408c44;
}

Assistant:

int ON_BoundingBox::GetClosestPoint( 
  const ON_Line& line, ON_3dPoint& box_point, double* t0, double* t1
  ) const
{
  if(!IsValid() || !line.IsValid()) 
		return 0;			
	
	ON_3dPoint closest;
	
	if(line.Direction().Length()<=ON_SQRT_EPSILON){
		ON_3dPoint center = line.PointAt(.5);
		if(t0) *t0 = 0.0;
		if(t1) *t1 = 1.0;
		box_point = ClosestPoint(center);
		return IsPointIn( center )? 3 : 1;
	}

	ON_Interval over[3];			//parameter overlap for each direction

	for(int j=0; j<3; j++){
		ON_Interval pl( line[0][j], line[1][j]);
		if( pl[0]!=pl[1])
			over[j]= ON_Interval(	pl.NormalizedParameterAt(Min()[j]),
														pl.NormalizedParameterAt(Max()[j])  );
		else 
			if( Min()[j]<=pl[0] && pl[0]<=Max()[j] )
				over[j]=ON_Interval(-ON_DBL_MAX, ON_DBL_MAX);
			else 
				over[j]=ON_Interval(ON_UNSET_VALUE, ON_UNSET_VALUE);
	}



	// Step 1.  Check for an intersection of the infinite line with the box
	ON_Interval overlap(-ON_DBL_MAX, ON_DBL_MAX);	
	bool nonempty=true;
  int i;
	for( i=0;i<3 && nonempty;i++)
		nonempty = overlap.Intersection(over[i]);
	
	if(nonempty){	// infinite line intersects box
		if( overlap.Intersection( ON_Interval(0,1) ) ){
			// Box & Line segment  intersect
			if(t0) *t0 = overlap[0];
			if(t1) *t1 = overlap[1];
			box_point = line.PointAt(overlap[0]);
			return (overlap.Length()>0)? 3 : 2;
		}
		// closest point is at end of line segment
		double EndInd=(overlap[1]<0)? 0.0: 1.0;
		if(t0) *t0 = EndInd;
		if(t1) *t1 = EndInd;
		return 1;
	}


	//  Step 2.  Check for closest point on box edge and line segment interior
	//   In this case when we project orthogonal to the box edge we get a line 
	//   in the plane that doesn't intersect the 2d-box in the plane.  The projection
  //   of the 3d closest point is the closest point of this 2d closest point problem.
	int k[3];
	for(i=0; i<3; i++)
  {
		// Project box and line onto coord plane with normal Unit(i).

		if(!overlap.Intersection( over[(i+1)%3], over[(i+2)%3] )){	
			// Projected line doesnt intersect the projexted box.  
			// Find the closest  vertex of the projected box.  
			ON_3dVector StdUnit(0,0,0);
			StdUnit[i]=1.0;
			ON_3dVector n = ON_CrossProduct(line.Direction(), StdUnit);
			if(n.Length()==0)
				continue;
			n.Unitize();
			int ilo[3]={0,0,0};
			int ihi[3]={1,1,1};
      int imin[3]={-1,-1,-1};
			double amin=0.0;
			ihi[i]=ilo[i];
			for(k[0]=ilo[0];  k[0]<=ihi[0]; k[0]++)
				for(k[1]=ilo[1];  k[1]<=ihi[1]; k[1]++)
					for(k[2]=ilo[2];  k[2]<=ihi[2]; k[2]++){
						double a = n*(Corner(k[0],k[1],k[2]) - line.from);
						if(amin == 0.0 || fabs(a)<fabs(amin))
            {
							amin= a;
							imin[0]=k[0]; imin[1]=k[1]; imin[2]=k[2];
						}
			}
      if ( imin[0] < 0 )
      {
        return 0;
      }
			ON_3dPoint vertex = Corner(imin[0],imin[1],imin[2]);
			vertex[i] = line.from[i];
			// Solve for 2d-closest point between closest corner and projected line 
			ON_3dVector ProjDir = line.Direction();
			ProjDir[i]=0.0;
			double t = ( vertex - line.from)*ProjDir / ProjDir.LengthSquared();
			ON_3dPoint cp = line.PointAt(t);
			if( 0<=t && t<=1 && m_min[i]<=cp[i] &&cp[i]<= m_max[i] ){
				if(t0) *t0 = t;		// found the  closest point 
				if(t1) *t1 = t;
				vertex[i] =  cp[i];
				box_point = vertex;
				return 1;
			}
		}
	}

	//Step 3. Check each Corner of the box for closest points
	for( k[0]=0; k[0]<2; k[0]++)
		for( k[1]=0; k[1]<2; k[1]++)
			for( k[2]=0; k[2]<2; k[2]++){
				ON_3dPoint corner = Corner(k[0],k[1],k[2]);
				double tstar;
				line.ClosestPointTo( corner, &tstar );
				ON_3dPoint cp = line.PointAt( tstar);
				ON_3dVector disp = cp - corner;
				bool InNCone=true;
				for(int j=0;j<2 && InNCone;j++){
					InNCone = InNCone && ( k[j] )? disp[j]>=0 : disp[j]<=0  ;
				}
				if(InNCone){
					if(t0) *t0 = tstar;
					if(t1) *t1 = tstar;
					box_point = corner;
					return 1;
				} 
	}

	//Step 4. Closest point is at a line end
	for(i=0; i<2; i++){
		closest = ClosestPoint(line[i]);
		double dot = (closest - line[i]) * line.Direction();
		if( (i==0 && dot<= 0) || (i==1 && dot>=0) )
    {
			if(t0) *t0 = i;
			if(t1) *t1 = i;
			box_point = closest;
			return 1;
		}
	}

  ON_ERROR("Should never get here.");
	return 0;  
}